

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

char * google::protobuf::internal::PackedEnumParserArg
                 (void *object,char *ptr,ParseContext *ctx,_func_bool_void_ptr_int *is_valid,
                 void *data,InternalMetadataWithArena *metadata,int field_num)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong extraout_RDX;
  char *ptr_00;
  byte *p;
  UnknownFieldSet *this;
  uint64 value;
  pair<const_char_*,_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  pair<const_char_*,_bool> pVar11;
  ulong uVar8;
  
  bVar1 = *ptr;
  uVar7 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar9 = ReadSizeFallback(ptr,(uint)bVar1);
    uVar7 = pVar9.second;
    ptr_00 = pVar9.first;
  }
  else {
    ptr_00 = ptr + 1;
  }
  if (ptr_00 != (char *)0x0) {
    pcVar3 = (ctx->super_EpsCopyInputStream).buffer_end_;
    uVar7 = uVar7 + ((int)ptr_00 - (int)pcVar3);
    uVar8 = (ulong)uVar7;
    (ctx->super_EpsCopyInputStream).limit_end_ = pcVar3 + (int)((int)uVar7 >> 0x1f & uVar7);
    iVar6 = (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar7;
    iVar6 = iVar6 - uVar7;
    if (-1 < iVar6) {
      while( true ) {
        if (ptr_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
          pVar11._8_8_ = 0;
          pVar11.first = ptr_00;
        }
        else {
          pVar11._9_7_ = (int7)(uVar8 >> 8);
          pVar11.second = true;
          pVar11.first = ptr_00;
          if ((long)ptr_00 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
              (long)(ctx->super_EpsCopyInputStream).limit_) {
            pVar11 = EpsCopyInputStream::DoneFallback(&ctx->super_EpsCopyInputStream,ptr_00,-1);
          }
        }
        p = (byte *)pVar11.first;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
        value = (uint64)(char)*p;
        pVar10.second = pVar11._8_8_;
        pVar10.first = (char *)(p + 1);
        if ((long)value < 0) {
          bVar1 = p[1];
          uVar7 = ((uint)*p + (uint)bVar1 * 0x80) - 0x80;
          if ((char)bVar1 < '\0') {
            pVar10 = VarintParseSlow64((char *)p,uVar7);
            value = pVar10.second;
          }
          else {
            value = (uint64)uVar7;
            pVar10.second = (ulong)bVar1 << 7;
            pVar10.first = (char *)(p + 2);
          }
        }
        ptr_00 = pVar10.first;
        if (ptr_00 == (char *)0x0) {
          return (char *)0x0;
        }
        bVar5 = (*is_valid)(data,(int)value);
        if (bVar5) {
          if (*object == *(int *)((long)object + 4)) {
            RepeatedField<int>::Reserve((RepeatedField<int> *)object,*(int *)((long)object + 4) + 1)
            ;
          }
          iVar2 = *object;
          uVar7 = iVar2 + 1;
          uVar8 = (ulong)uVar7;
          *(uint *)object = uVar7;
          *(int *)(*(long *)((long)object + 8) + (long)iVar2 * 4) = (int)value;
        }
        else {
          pvVar4 = (metadata->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar4 & 1) == 0) {
            this = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ::mutable_unknown_fields_slow
                             (&metadata->
                               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             );
          }
          else {
            this = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
          }
          UnknownFieldSet::AddVarint(this,field_num,value);
          uVar8 = extraout_RDX;
        }
      }
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
        uVar7 = iVar6 + (ctx->super_EpsCopyInputStream).limit_;
        (ctx->super_EpsCopyInputStream).limit_ = uVar7;
        (ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar7 >> 0x1f & uVar7);
        return (char *)p;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* PackedEnumParserArg(void* object, const char* ptr,
                                ParseContext* ctx,
                                bool (*is_valid)(const void*, int),
                                const void* data,
                                InternalMetadataWithArena* metadata,
                                int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, data, metadata, field_num](uint64 val) {
        if (is_valid(data, val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields());
        }
      });
}